

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall
soul::heart::Parser::scanFunction(Parser *this,ScannedTopLevelItem *item,bool isEventFunction)

{
  bool bVar1;
  string *psVar2;
  Module *pMVar3;
  Function *pFVar4;
  Identifier *args;
  Identifier *args_00;
  string_view name_00;
  UTF8Reader local_128;
  char *local_120;
  char *local_118;
  undefined1 local_110 [32];
  UTF8Reader local_f0;
  string local_e8;
  Function *local_c8;
  Function *fn;
  string_view local_88;
  undefined1 local_78 [80];
  Identifier local_28;
  Identifier name;
  bool isEventFunction_local;
  ScannedTopLevelItem *item_local;
  Parser *this_local;
  
  name.name._7_1_ = isEventFunction;
  local_28 = parseGeneralIdentifier(this);
  if ((name.name._7_1_ & 1) != 0) {
    psVar2 = Identifier::operator_cast_to_string_(&local_28);
    bVar1 = isReservedFunctionName(psVar2);
    if (bVar1) {
      Errors::invalidEndpointName<soul::Identifier&>
                ((CompileMessage *)(local_78 + 0x18),(Errors *)&local_28,args);
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,(CompileMessage *)(local_78 + 0x18));
      CompileMessage::~CompileMessage((CompileMessage *)(local_78 + 0x18));
    }
  }
  pMVar3 = pool_ptr<soul::Module>::operator->(&this->module);
  local_88 = Identifier::operator_cast_to_basic_string_view(&local_28);
  name_00._M_str = (char *)local_88._M_len;
  name_00._M_len = (size_t)&pMVar3->functions;
  Module::Functions::find((Functions *)local_78,name_00);
  bVar1 = pool_ptr<soul::heart::Function>::operator!=
                    ((pool_ptr<soul::heart::Function> *)local_78,(void *)0x0);
  pool_ptr<soul::heart::Function>::~pool_ptr((pool_ptr<soul::heart::Function> *)local_78);
  if (bVar1) {
    Errors::nameInUse<soul::Identifier&>((CompileMessage *)&fn,(Errors *)&local_28,args_00);
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,(CompileMessage *)&fn);
    CompileMessage::~CompileMessage((CompileMessage *)&fn);
  }
  pMVar3 = pool_ptr<soul::Module>::operator->(&this->module);
  psVar2 = Identifier::operator_cast_to_string_(&local_28);
  std::__cxx11::string::string((string *)&local_e8,(string *)psVar2);
  pFVar4 = Module::Functions::add(&pMVar3->functions,&local_e8,(bool)(name.name._7_1_ & 1));
  std::__cxx11::string::~string((string *)&local_e8);
  local_f0.data = "(";
  local_c8 = pFVar4;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x4d4496);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  getCurrentTokeniserPosition
            ((Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              *)(local_110 + 0x18));
  std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::push_back
            (&item->functionParamCode,(value_type *)(local_110 + 0x18));
  local_110._16_8_ = ")";
  skipPastNextOccurrenceOf(this,(TokenType)0x4d2078);
  while( true ) {
    local_110._8_8_ = "{";
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)"{");
    if (bVar1) {
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      getCurrentTokeniserPosition
                ((Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  *)local_110);
      std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::push_back
                (&item->functionBodyCode,(value_type *)local_110);
      local_118 = "}";
      skipPastNextOccurrenceOf(this,(TokenType)0x4ad7e6);
      return;
    }
    local_120 = ";";
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x4ad30b);
    if (bVar1) break;
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)"[[");
    if (bVar1) {
      skipPastNextOccurrenceOf(this,(TokenType)0x4aea03);
    }
    else {
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matches(&this->
                         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ,(TokenType)"$eof");
      if (bVar1) {
        Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ::expect<soul::TokenType>
                  (&this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                   ,(TokenType)"{");
      }
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      skip(&this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          );
    }
  }
  local_c8->hasNoBody = true;
  UTF8Reader::UTF8Reader(&local_128);
  std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::push_back
            (&item->functionBodyCode,&local_128);
  return;
}

Assistant:

void scanFunction (ScannedTopLevelItem& item, bool isEventFunction)
    {
        auto name = parseGeneralIdentifier();

        if (isEventFunction && heart::isReservedFunctionName (name))
            throwError (Errors::invalidEndpointName (name));

        if (module->functions.find (name) != nullptr)
            throwError (Errors::nameInUse (name));

        auto& fn = module->functions.add (name, isEventFunction);

        expect (HEARTOperator::openParen);
        item.functionParamCode.push_back (getCurrentTokeniserPosition());
        skipPastNextOccurrenceOf (HEARTOperator::closeParen);

        for (;;)
        {
            if (matchIf (HEARTOperator::openBrace))
            {
                item.functionBodyCode.push_back (getCurrentTokeniserPosition());
                skipPastNextOccurrenceOf (HEARTOperator::closeBrace);
                break;
            }

            if (matchIf (HEARTOperator::semicolon))
            {
                fn.hasNoBody = true;
                item.functionBodyCode.push_back ({});
                break;
            }

            if (matchIf (HEARTOperator::openDoubleBracket))
            {
                skipPastNextOccurrenceOf (HEARTOperator::closeDoubleBracket);
                continue;
            }

            if (matches (Token::eof))
                expect (HEARTOperator::openBrace);

            skip();
        }
    }